

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

rel_iterator * __thiscall
dg::vr::ValueRelations::begin_related(ValueRelations *this,V val,Relations *rels)

{
  const_iterator this_00;
  Handle in_RSI;
  ValueRelations *in_RDI;
  Handle h;
  ValueRelations *v;
  
  v = in_RDI;
  this_00 = std::
            map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
            ::find((map<const_llvm::Value_*,_std::reference_wrapper<const_dg::vr::Bucket>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                    *)in_RDI,(key_type *)0x208f1c);
  std::
  _Rb_tree_const_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>
                *)0x208f2b);
  std::reference_wrapper::operator_cast_to_Bucket_
            ((reference_wrapper<const_dg::vr::Bucket> *)0x208f37);
  RelatedValueIterator::RelatedValueIterator
            ((RelatedValueIterator *)this_00._M_node,v,in_RSI,(Relations *)in_RDI);
  return (rel_iterator *)v;
}

Assistant:

ValueRelations::rel_iterator
ValueRelations::begin_related(V val, const Relations &rels) const {
    assert(valToBucket.find(val) != valToBucket.end());
    Handle h = valToBucket.find(val)->second;
    return {*this, h, rels};
}